

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_counted_impl.hpp
# Opt level: O1

void __thiscall
boost::detail::sp_counted_impl_p<boost::runtime::cla::rt_cla_detail::parameter_trie>::dispose
          (sp_counted_impl_p<boost::runtime::cla::rt_cla_detail::parameter_trie> *this)

{
  parameter_trie *this_00;
  pointer prVar1;
  
  this_00 = this->px_;
  if (this_00 != (parameter_trie *)0x0) {
    shared_count::~shared_count(&(this_00->m_param_candidate).pn);
    prVar1 = (this_00->m_id_candidates).
             super__Vector_base<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>,_std::allocator<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (prVar1 != (pointer)0x0) {
      operator_delete(prVar1,(long)(this_00->m_id_candidates).
                                   super__Vector_base<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>,_std::allocator<boost::reference_wrapper<const_boost::runtime::parameter_cla_id>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)prVar1
                     );
    }
    std::
    _Rb_tree<char,_std::pair<const_char,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>,_std::_Select1st<std::pair<const_char,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>,_std::less<char>,_std::allocator<std::pair<const_char,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>_>
    ::~_Rb_tree((_Rb_tree<char,_std::pair<const_char,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>,_std::_Select1st<std::pair<const_char,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>,_std::less<char>,_std::allocator<std::pair<const_char,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>_>
                 *)this_00);
    operator_delete(this_00,0x60);
    return;
  }
  return;
}

Assistant:

virtual void dispose() // nothrow
    {
#if defined(BOOST_SP_ENABLE_DEBUG_HOOKS)
        boost::sp_scalar_destructor_hook( px_, sizeof(X), this );
#endif
        boost::checked_delete( px_ );
    }